

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_cast_helpers.cpp
# Opt level: O2

bool duckdb::SkipToClose(StringCastInputState *input_state)

{
  char cVar1;
  ulong *puVar2;
  ulong *puVar3;
  bool bVar4;
  reference pvVar5;
  ulong uVar6;
  bool bVar7;
  bool bVar8;
  vector<char,_true> brackets;
  char local_49;
  _Vector_base<char,_std::allocator<char>_> local_48;
  
  puVar2 = input_state->pos;
  puVar3 = input_state->len;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar6 = *puVar2;
  do {
    if (*puVar3 <= uVar6) {
      bVar7 = false;
LAB_013bd5cc:
      ::std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_48);
      return bVar7;
    }
    cVar1 = input_state->buf[uVar6];
    if (cVar1 == '\"') {
LAB_013bd530:
      if (input_state->escaped != false) goto LAB_013bd5a3;
      bVar4 = SkipToCloseQuotes(input_state);
      bVar7 = false;
      bVar8 = false;
      if (!bVar4) goto LAB_013bd5cc;
    }
    else {
      if (cVar1 == '{') {
        local_49 = '}';
        ::std::vector<char,_std::allocator<char>_>::emplace_back<char>
                  ((vector<char,_std::allocator<char>_> *)&local_48,&local_49);
      }
      else if (cVar1 == '(') {
        local_49 = ')';
        ::std::vector<char,_std::allocator<char>_>::emplace_back<char>
                  ((vector<char,_std::allocator<char>_> *)&local_48,&local_49);
      }
      else if (cVar1 == '[') {
        local_49 = ']';
        ::std::vector<char,_std::allocator<char>_>::emplace_back<char>
                  ((vector<char,_std::allocator<char>_> *)&local_48,&local_49);
      }
      else {
        if (cVar1 == '\'') goto LAB_013bd530;
        pvVar5 = vector<char,_true>::back((vector<char,_true> *)&local_48);
        if (cVar1 != *pvVar5) {
          bVar8 = input_state->buf[*puVar2] == '\\';
          goto LAB_013bd5a5;
        }
        local_48._M_impl.super__Vector_impl_data._M_finish =
             local_48._M_impl.super__Vector_impl_data._M_finish + -1;
        if (local_48._M_impl.super__Vector_impl_data._M_start ==
            local_48._M_impl.super__Vector_impl_data._M_finish) {
          bVar7 = true;
          goto LAB_013bd5cc;
        }
      }
LAB_013bd5a3:
      bVar8 = false;
    }
LAB_013bd5a5:
    input_state->escaped = bVar8;
    uVar6 = *puVar2 + 1;
    *puVar2 = uVar6;
  } while( true );
}

Assistant:

static bool SkipToClose(StringCastInputState &input_state) {
	auto &idx = input_state.pos;
	auto &buf = input_state.buf;
	auto &len = input_state.len;

	D_ASSERT(buf[idx] == '{' || buf[idx] == '[' || buf[idx] == '(');

	vector<char> brackets;
	while (idx < len) {
		bool set_escaped = false;
		if (buf[idx] == '"' || buf[idx] == '\'') {
			if (!input_state.escaped) {
				if (!SkipToCloseQuotes(input_state)) {
					return false;
				}
			}
		} else if (buf[idx] == '{') {
			brackets.push_back('}');
		} else if (buf[idx] == '(') {
			brackets.push_back(')');
		} else if (buf[idx] == '[') {
			brackets.push_back(']');
		} else if (buf[idx] == brackets.back()) {
			brackets.pop_back();
			if (brackets.empty()) {
				return true;
			}
		} else if (buf[idx] == '\\') {
			//! Note that we don't treat `\\` special here, backslashes can't be escaped outside of quotes
			//! backslashes within quotes will not be encountered in this function
			set_escaped = true;
		}
		input_state.escaped = set_escaped;
		idx++;
	}
	return false;
}